

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclBuffer.c
# Opt level: O3

Abc_Obj_t * Abc_BufFindNonBuffDriver(Buf_Man_t *p,Abc_Obj_t *pObj)

{
  uint uVar1;
  int iVar2;
  
  uVar1 = *(uint *)&pObj->field_0x14;
  while( true ) {
    if ((uVar1 & 0xf) != 7) {
      return pObj;
    }
    iVar2 = Abc_NodeIsBuf(pObj);
    if (iVar2 == 0) break;
    pObj = (Abc_Obj_t *)pObj->pNtk->vObjs->pArray[*(pObj->vFanins).pArray];
    uVar1 = *(uint *)&pObj->field_0x14;
  }
  return pObj;
}

Assistant:

Abc_Obj_t * Abc_BufFindNonBuffDriver( Buf_Man_t * p, Abc_Obj_t * pObj )
{
    return (Abc_ObjIsNode(pObj) && Abc_NodeIsBuf(pObj)) ? Abc_BufFindNonBuffDriver(p, Abc_ObjFanin0(pObj)) : pObj;
}